

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseScript
          (WastParser *this,unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script
          )

{
  vector<wabt::Error,std::allocator<wabt::Error>> *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result result;
  pointer pMVar2;
  pointer pSVar3;
  pointer commands;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fb;
  allocator<char> local_fa;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string asStack_d8 [32];
  iterator local_b8;
  size_type local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  Location local_90;
  ErrorLevel local_70;
  Enum local_6c;
  _Type local_68;
  uint local_60;
  Enum local_5c;
  Location local_58;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> local_38;
  __single_object command;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> local_28;
  __single_object script;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script_local;
  WastParser *this_local;
  
  script._M_t.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
  super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true>)
       (__uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true>)out_script;
  std::make_unique<wabt::Script>();
  command._M_t.super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
  ._M_t.super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
  super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>)
       PeekPair(this);
  bVar1 = anon_unknown_1::IsModuleField
                    ((TokenTypePair)
                     command._M_t.
                     super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                     .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl);
  if ((bVar1) || (bVar1 = PeekIsCustom(this), bVar1)) {
    std::make_unique<wabt::ModuleCommand>();
    GetLocation(&local_58,this);
    pMVar2 = std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::
             operator->(&local_38);
    (pMVar2->module).loc.filename._M_len = local_58.filename._M_len;
    (pMVar2->module).loc.filename._M_str = local_58.filename._M_str;
    (pMVar2->module).loc.field_1.field_1.offset = (size_t)local_58.field_1.field_1.offset;
    *(undefined8 *)((long)&(pMVar2->module).loc.field_1 + 8) = local_58.field_1._8_8_;
    pMVar2 = std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::
             operator->(&local_38);
    local_5c = (Enum)ParseModuleFieldList(this,&pMVar2->module);
    bVar1 = Failed((Result)local_5c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      pSVar3 = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::operator->
                         (&local_28);
      std::
      vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
      ::emplace_back<std::unique_ptr<wabt::ModuleCommand,std::default_delete<wabt::ModuleCommand>>>
                ((vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
                  *)pSVar3,&local_38);
    }
    local_60 = (uint)bVar1;
    std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::~unique_ptr
              (&local_38);
    if (local_60 != 0) goto LAB_00207017;
  }
  else {
    local_68 = (_Type)PeekPair(this);
    bVar1 = anon_unknown_1::IsCommand((TokenTypePair)local_68);
    if (bVar1) {
      pSVar3 = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::get(&local_28);
      commands = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::operator->
                           (&local_28);
      local_6c = (Enum)ParseCommandList(this,pSVar3,&commands->commands);
      bVar1 = Failed((Result)local_6c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_60 = 1;
        goto LAB_00207017;
      }
    }
    else {
      bVar1 = PeekMatch(this,Eof,0);
      if (bVar1) {
        this_00 = (vector<wabt::Error,std::allocator<wabt::Error>> *)this->errors_;
        local_70 = Warning;
        GetLocation(&local_90,this);
        std::vector<wabt::Error,std::allocator<wabt::Error>>::
        emplace_back<wabt::ErrorLevel,wabt::Location,char_const(&)[13]>
                  (this_00,&local_70,&local_90,(char (*) [13])"empty script");
      }
      else {
        ConsumeIfLpar(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"a module field",&local_f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(asStack_d8,"a command",&local_fa);
        local_b8 = &local_f8;
        local_b0 = 2;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_fb);
        __l._M_len = local_b0;
        __l._M_array = local_b8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_a8,__l,&local_fb);
        ErrorExpected(this,&local_a8,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a8);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_fb);
        local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8;
        do {
          local_128 = local_128 + -1;
          std::__cxx11::string::~string((string *)local_128);
        } while (local_128 != &local_f8);
        std::allocator<char>::~allocator(&local_fa);
        std::allocator<char>::~allocator(&local_f9);
      }
    }
  }
  result = Expect(this,Eof);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    local_60 = 1;
  }
  else {
    bVar1 = HasError(this);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_60 = 1;
    }
    else {
      std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::operator=
                ((unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)
                 script._M_t.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>
                 ._M_t.super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                 super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,&local_28);
      Result::Result((Result *)((long)&this_local + 4),Ok);
      local_60 = 1;
    }
  }
LAB_00207017:
  std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::~unique_ptr(&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseScript(std::unique_ptr<Script>* out_script) {
  WABT_TRACE(ParseScript);
  auto script = std::make_unique<Script>();

  // Don't consume the Lpar yet, even though it is required. This way the
  // sub-parser functions (e.g. ParseFuncModuleField) can consume it and keep
  // the parsing structure more regular.
  if (IsModuleField(PeekPair()) || PeekIsCustom()) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    auto command = std::make_unique<ModuleCommand>();
    command->module.loc = GetLocation();
    CHECK_RESULT(ParseModuleFieldList(&command->module));
    script->commands.emplace_back(std::move(command));
  } else if (IsCommand(PeekPair())) {
    CHECK_RESULT(ParseCommandList(script.get(), &script->commands));
  } else if (PeekMatch(TokenType::Eof)) {
    errors_->emplace_back(ErrorLevel::Warning, GetLocation(), "empty script");
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a command"});
  }

  EXPECT(Eof);
  if (!HasError()) {
    *out_script = std::move(script);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}